

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  WebData wdata_00;
  long in_RSI;
  int in_EDI;
  SUNContext ctx;
  sunrealtype nrmfac;
  int nrmfactor;
  int iout;
  int mxns;
  int ns;
  int flag;
  int gstype;
  int jpre;
  int firstrun;
  void *arkode_mem;
  SUNLinearSolver LS;
  WebData wdata;
  N_Vector c;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype reltol;
  sunrealtype abstol;
  uint in_stack_ffffffffffffff7c;
  WebData in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  int iVar5;
  int in_stack_ffffffffffffff94;
  int mxns_00;
  int iVar6;
  int iVar7;
  uint uVar8;
  void *arkode_mem_00;
  undefined8 local_48;
  double local_30;
  WebData in_stack_ffffffffffffffd8;
  N_Vector c_00;
  int local_4;
  
  c_00 = (N_Vector)&DAT_3ee4f8b588e368f1;
  local_48 = 0;
  arkode_mem_00 = (void *)0x0;
  iVar5 = 0;
  SUNContext_Create(0,&stack0xffffffffffffff80);
  iVar1 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c);
  if (iVar1 == 0) {
    if (1 < in_EDI) {
      iVar5 = atoi(*(char **)(in_RSI + 8));
    }
    uVar4 = N_VNew_Serial(0xd8,in_stack_ffffffffffffff80);
    iVar1 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff7c);
    if (iVar1 == 0) {
      wdata_00 = AllocUserData((SUNContext)CONCAT44(in_stack_ffffffffffffff94,iVar5));
      iVar1 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
      if (iVar1 == 0) {
        InitUserData(wdata_00);
        iVar1 = wdata_00->ns;
        mxns_00 = wdata_00->mxns;
        PrintIntro();
        for (iVar7 = 1; iVar7 < 3; iVar7 = iVar7 + 1) {
          for (iVar6 = 1; iVar6 < 3; iVar6 = iVar6 + 1) {
            CInit(c_00,in_stack_ffffffffffffffd8);
            PrintHeader(0,0x10261c);
            uVar8 = in_stack_ffffffffffffff7c & 0xffffff;
            if (iVar7 == 1) {
              uVar8 = CONCAT13(iVar6 == 1,(int3)in_stack_ffffffffffffff7c);
            }
            in_stack_ffffffffffffff7c = uVar8;
            uVar8 = in_stack_ffffffffffffff7c >> 0x18;
            if (uVar8 == 0) {
              ARKStepReInit(0,arkode_mem_00,0,f,uVar4);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              SUNLinSol_SPGMRSetPrecType(local_48,iVar7);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              uVar3 = SUNLinSol_SPGMRSetGSType(local_48,iVar6);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              arkode_mem_00 = (void *)ARKStepCreate(0,0,f,uVar4,in_stack_ffffffffffffff80);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              wdata_00->arkode_mem = arkode_mem_00;
              ARKodeSetUserData(arkode_mem_00,wdata_00);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              ARKodeSStolerances(c_00,&DAT_3ee4f8b588e368f1,arkode_mem_00);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              ARKodeSetMaxNumSteps(arkode_mem_00,1000);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              ARKodeSetNonlinConvCoef(0x3f50624dd2f1a9fc,arkode_mem_00);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              local_48 = SUNLinSol_SPGMR(uVar4,iVar7,0,in_stack_ffffffffffffff80);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              ARKodeSetLinearSolver(arkode_mem_00,local_48,0);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              SUNLinSol_SPGMRSetGSType(local_48,iVar6);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              ARKodeSetEpsLin(0,arkode_mem_00);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              ARKodeSetPreconditioner(arkode_mem_00,Precond,PSolve);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
              if (iVar5 == 1) {
                in_stack_ffffffffffffff88 = (void *)sqrt(216.0);
              }
              else if (iVar5 == 2) {
                in_stack_ffffffffffffff88 = (void *)0xbff0000000000000;
              }
              else {
                in_stack_ffffffffffffff88 = (void *)0x0;
              }
              uVar3 = ARKodeSetLSNormFactor(in_stack_ffffffffffffff88,arkode_mem_00);
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) {
                return 1;
              }
            }
            if (uVar8 != 0) {
              PrintAllSpecies((N_Vector)CONCAT44(iVar6,uVar3),iVar1,mxns_00,
                              (sunrealtype)CONCAT44(in_stack_ffffffffffffff94,iVar5));
            }
            local_30 = 1e-08;
            for (in_stack_ffffffffffffff94 = 1; in_stack_ffffffffffffff94 < 0x13;
                in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
              uVar3 = ARKodeEvolve(local_30,arkode_mem_00,uVar4,&stack0xffffffffffffffd8,1);
              PrintOutput(arkode_mem_00,(sunrealtype)CONCAT44(uVar8,iVar7));
              if ((uVar8 != 0) && (in_stack_ffffffffffffff94 % 3 == 0)) {
                PrintAllSpecies((N_Vector)CONCAT44(iVar6,uVar3),iVar1,mxns_00,
                                (sunrealtype)CONCAT44(in_stack_ffffffffffffff94,iVar5));
              }
              iVar2 = check_flag(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
              if (iVar2 != 0) break;
              if (local_30 <= 0.9) {
                local_30 = local_30 * 10.0;
              }
              else {
                local_30 = local_30 + 1.0;
              }
            }
            PrintFinalStats((void *)nrmfac);
          }
        }
        ARKodeFree(&stack0xffffffffffffffb0);
        N_VDestroy(uVar4);
        SUNLinSolFree(local_48);
        FreeUserData(in_stack_ffffffffffffff80);
        SUNContext_Free(&stack0xffffffffffffff80);
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t, tout;
  N_Vector c         = NULL;
  WebData wdata      = NULL;
  SUNLinearSolver LS = NULL;
  void* arkode_mem   = NULL;
  sunbooleantype firstrun;
  int jpre, gstype, flag;
  int ns, mxns, iout;
  int nrmfactor = 0;  /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }

  /* Initializations */
  c = N_VNew_Serial(NEQ, ctx);
  if (check_flag((void*)c, "N_VNew_Serial", 0)) { return (1); }
  wdata = AllocUserData(ctx);
  if (check_flag((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);
  ns   = wdata->ns;
  mxns = wdata->mxns;

  /* Print problem description */
  PrintIntro();

  /* Loop over jpre and gstype (four cases) */
  for (jpre = SUN_PREC_LEFT; jpre <= SUN_PREC_RIGHT; jpre++)
  {
    for (gstype = SUN_MODIFIED_GS; gstype <= SUN_CLASSICAL_GS; gstype++)
    {
      /* Initialize c and print heading */
      CInit(c, wdata);
      PrintHeader(jpre, gstype);

      /* Call ARKStepCreate or ARKStepReInit, then SPGMR to set up problem */

      firstrun = (jpre == SUN_PREC_LEFT) && (gstype == SUN_MODIFIED_GS);
      if (firstrun)
      {
        arkode_mem = ARKStepCreate(NULL, f, T0, c, ctx);
        if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return (1); }

        wdata->arkode_mem = arkode_mem;

        flag = ARKodeSetUserData(arkode_mem, wdata);
        if (check_flag(&flag, "ARKodeSetUserData", 1)) { return (1); }

        flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
        if (check_flag(&flag, "ARKodeSStolerances", 1)) { return (1); }

        flag = ARKodeSetMaxNumSteps(arkode_mem, 1000);
        if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return (1); }

        flag = ARKodeSetNonlinConvCoef(arkode_mem, 1.e-3);
        if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return (1); }

        LS = SUNLinSol_SPGMR(c, jpre, MAXL, ctx);
        if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

        flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
        if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }

        flag = SUNLinSol_SPGMRSetGSType(LS, gstype);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

        flag = ARKodeSetEpsLin(arkode_mem, DELT);
        if (check_flag(&flag, "ARKodeSetEpsLin", 1)) { return (1); }

        flag = ARKodeSetPreconditioner(arkode_mem, Precond, PSolve);
        if (check_flag(&flag, "ARKodeSetPreconditioner", 1)) { return (1); }

        /* Set the linear solver tolerance conversion factor */
        switch (nrmfactor)
        {
        case (1):
          /* use the square root of the vector length */
          nrmfac = SQRT((sunrealtype)NEQ);
          break;
        case (2):
          /* compute with dot product */
          nrmfac = -ONE;
          break;
        default:
          /* use the default */
          nrmfac = ZERO;
          break;
        }

        flag = ARKodeSetLSNormFactor(arkode_mem, nrmfac);
        if (check_flag(&flag, "ARKodeSetLSNormFactor", 1)) { return (1); }
      }
      else
      {
        flag = ARKStepReInit(arkode_mem, NULL, f, T0, c);
        if (check_flag(&flag, "ARKStepReInit", 1)) { return (1); }

        flag = SUNLinSol_SPGMRSetPrecType(LS, jpre);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetPrecType", 1)) { return (1); }

        flag = SUNLinSol_SPGMRSetGSType(LS, gstype);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }
      }

      /* Print initial values */
      if (firstrun) { PrintAllSpecies(c, ns, mxns, T0); }

      /* Loop over output points, call ARKodeEvolve, print sample solution values. */
      tout = T1;
      for (iout = 1; iout <= NOUT; iout++)
      {
        flag = ARKodeEvolve(arkode_mem, tout, c, &t, ARK_NORMAL);
        PrintOutput(arkode_mem, t);
        if (firstrun && (iout % 3 == 0)) { PrintAllSpecies(c, ns, mxns, t); }
        if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
        if (tout > SUN_RCONST(0.9)) { tout += DTOUT; }
        else { tout *= TOUT_MULT; }
      }

      /* Print final statistics, and loop for next case */
      PrintFinalStats(arkode_mem);
    }
  }

  /* Free all memory */
  ARKodeFree(&arkode_mem);
  N_VDestroy(c);
  SUNLinSolFree(LS);
  FreeUserData(wdata);
  SUNContext_Free(&ctx);

  return (0);
}